

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WattSpectrum.hpp
# Opt level: O3

void __thiscall njoy::ENDFtk::section::Type<5>::WattSpectrum::~WattSpectrum(WattSpectrum *this)

{
  void *pvVar1;
  long lVar2;
  
  lVar2 = 0x120;
  do {
    pvVar1 = *(void **)((long)(this->parameters_)._M_elems + lVar2 + -0x18);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)(this->parameters_)._M_elems + lVar2 + -8) -
                             (long)pvVar1);
    }
    pvVar1 = *(void **)((long)(this->parameters_)._M_elems + lVar2 + -0x30);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)(this->parameters_)._M_elems + lVar2 + -0x20) -
                             (long)pvVar1);
    }
    pvVar1 = *(void **)((long)(this->parameters_)._M_elems + lVar2 + -0x48);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)(this->parameters_)._M_elems + lVar2 + -0x38) -
                             (long)pvVar1);
    }
    pvVar1 = *(void **)((long)(this->parameters_)._M_elems + lVar2 + -0x60);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)(this->parameters_)._M_elems + lVar2 + -0x50) -
                             (long)pvVar1);
    }
    lVar2 = lVar2 + -0x90;
  } while (lVar2 != 0);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT WattSpectrum {

  std::array< Parameter, 2 > parameters_;

  /* auxiliary functions */
  #include "ENDFtk/section/5/WattSpectrum/src/readParameters.hpp"

public:

  /* constructor */
  #include "ENDFtk/section/5/WattSpectrum/src/ctor.hpp"

  /* get methods */

  /**
   *  @brief Return the distribution type (the LF flag)
   */
  static constexpr int LF() { return 11; }

  /**
   *  @brief Return the distribution type (the LF flag)
   */
  int LAW() const { return this->LF(); }

  /**
   *  @brief Return the a parameter data
   */
  const Parameter& a() const { return this->parameters_[0]; }

  /**
   *  @brief Return the b parameter data
   */
  const Parameter& b() const { return this->parameters_[1]; }

  #include "ENDFtk/section/5/WattSpectrum/src/NC.hpp"
  #include "ENDFtk/section/5/WattSpectrum/src/print.hpp"
}